

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_CodePrinter.h
# Opt level: O0

size_t __thiscall choc::text::findLineSplitPoint(text *this,string_view text,size_t targetLength)

{
  char c_00;
  char *pcVar1;
  char *__pos;
  char cVar2;
  bool bVar3;
  char *pcVar4;
  const_reference pvVar5;
  anon_class_1_0_00000001 local_32;
  char local_31;
  value_type c;
  anon_class_1_0_00000001 canBreakAfterChar;
  char *pcStack_30;
  char currentQuote;
  size_t pos;
  size_t targetLength_local;
  string_view text_local;
  
  text_local._M_len = text._M_len;
  pcStack_30 = (char *)0x0;
  local_31 = '\0';
  cVar2 = local_31;
  targetLength_local = (size_t)this;
  while( true ) {
    local_31 = cVar2;
    pcVar1 = pcStack_30;
    pcVar4 = (char *)std::basic_string_view<char,_std::char_traits<char>_>::length
                               ((basic_string_view<char,_std::char_traits<char>_> *)
                                &targetLength_local);
    __pos = pcStack_30;
    if (pcVar1 == pcVar4) {
      return (size_t)pcStack_30;
    }
    pcStack_30 = pcStack_30 + 1;
    pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)&targetLength_local,
                        (size_type)__pos);
    c_00 = *pvVar5;
    if (((text._M_str <= pcStack_30) && (local_31 == '\0')) &&
       (bVar3 = findLineSplitPoint::anon_class_1_0_00000001::operator()(&local_32,c_00), bVar3))
    break;
    if (((c_00 == '\"') || (cVar2 = local_31, c_00 == '\'')) &&
       ((cVar2 = c_00, local_31 != '\0' && (cVar2 = local_31, local_31 == c_00)))) {
      local_31 = '\0';
      cVar2 = local_31;
    }
  }
  return (size_t)pcStack_30;
}

Assistant:

static inline size_t findLineSplitPoint (std::string_view text, size_t targetLength)
{
    size_t pos = 0;
    char currentQuote = 0;
    auto canBreakAfterChar = [] (char c)  { return c == ' ' || c == '\t' || c == ',' || c == ';' || c == '\n'; };

    for (;;)
    {
        if (pos == text.length())
            return pos;

        auto c = text[pos++];

        if (pos >= targetLength && currentQuote == 0 && canBreakAfterChar (c))
            return pos;

        if (c == '"' || c == '\'')
        {
            if (currentQuote == 0)      currentQuote = c;
            else if (currentQuote == c) currentQuote = 0;
        }
    }
}